

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_0::GroupClassInfo::permute(GroupClassInfo *this,RecGroupInfo *info)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  pointer pHVar1;
  pointer puVar2;
  HeapType HVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 local_50 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> canonical;
  
  uVar6 = (long)(info->group).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(info->group).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar6 == (long)(info->permutation).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(info->permutation).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) {
    this_00 = &info->permutation;
    uVar7 = ((long)(this->subtypeGraph).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->subtypeGraph).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_50,
               uVar6 + (uVar6 < uVar7),
               (allocator_type *)
               ((long)&canonical.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pHVar1 = (info->group).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(info->group).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pHVar1;
    if (lVar4 != 0) {
      puVar2 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = 0;
      do {
        ((pointer)((long)local_50 + (ulong)(puVar2[uVar5] + (uint)(uVar6 < uVar7)) * 8))->id =
             pHVar1[uVar5].id;
        uVar5 = uVar5 + 1;
      } while ((uVar5 & 0xffffffff) < (ulong)(lVar4 >> 3));
    }
    if ((this->brand).
        super__Optional_base<wasm::(anonymous_namespace)::BrandTypeIterator,_false,_false>.
        _M_payload.
        super__Optional_payload<wasm::(anonymous_namespace)::BrandTypeIterator,_true,_false,_false>.
        super__Optional_payload_base<wasm::(anonymous_namespace)::BrandTypeIterator>._M_engaged !=
        false) {
      HVar3 = BrandTypeIterator::operator*((BrandTypeIterator *)&this->brand);
      *(uintptr_t *)local_50 = HVar3.id;
    }
    if (uVar6 < uVar7) {
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::resize
                (&info->group,
                 ((long)(info->group).
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(info->group).
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) + 1);
      info->hasBrand = true;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(this_00,&(this->orders).buf)
    ;
    pHVar1 = (info->group).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(info->group).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pHVar1;
    if (lVar4 != 0) {
      puVar2 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = 0;
      do {
        pHVar1[uVar6].id = ((pointer)((long)local_50 + (ulong)puVar2[uVar6] * 8))->id;
        uVar6 = uVar6 + 1;
      } while ((uVar6 & 0xffffffff) < (ulong)(lVar4 >> 3));
    }
    if (local_50 != (undefined1  [8])0x0) {
      operator_delete((void *)local_50,
                      (long)canonical.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_50);
    }
    return;
  }
  __assert_fail("info.group.size() == info.permutation.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                ,0x121,"void wasm::(anonymous namespace)::GroupClassInfo::permute(RecGroupInfo &)");
}

Assistant:

void GroupClassInfo::permute(RecGroupInfo& info) {
  assert(info.group.size() == info.permutation.size());
  bool insertingBrand = info.group.size() < subtypeGraph.size();
  // First, un-permute the group to get back to the canonical order, offset by 1
  // if we are newly inserting a brand.
  std::vector<HeapType> canonical(info.group.size() + insertingBrand);
  for (Index i = 0; i < info.group.size(); ++i) {
    canonical[info.permutation[i] + insertingBrand] = info.group[i];
  }
  // Update the brand.
  if (brand) {
    canonical[0] = **brand;
  }
  if (insertingBrand) {
    info.group.resize(info.group.size() + 1);
    info.hasBrand = true;
  }
  // Finally, re-permute with the new permutation..
  info.permutation = *orders;
  for (Index i = 0; i < info.group.size(); ++i) {
    info.group[i] = canonical[info.permutation[i]];
  }
}